

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Map_Time_t * Abc_NtkMapCopyCoRequiredCon(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Map_Time_t *pMVar2;
  Scl_Con_t *pSVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  
  iVar1 = pNtk->vCos->nSize;
  pMVar2 = (Map_Time_t *)calloc((long)iVar1,0xc);
  pfVar4 = &pMVar2->Worst;
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    pSVar3 = Scl_ConReadMan();
    iVar1 = Vec_IntEntry(&pSVar3->vOutReqs,(int)lVar5);
    fVar6 = (float)iVar1 / 1000.0;
    *pfVar4 = fVar6;
    ((Map_Time_t *)(pfVar4 + -2))->Rise = fVar6;
    pfVar4[-1] = fVar6;
    iVar1 = pNtk->vCos->nSize;
    pfVar4 = pfVar4 + 3;
  }
  return pMVar2;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCoRequiredCon( Abc_Ntk_t * pNtk )
{
    Map_Time_t * p; int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCoNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        p[i].Fall = p[i].Rise = p[i].Worst = Scl_Int2Flt( Scl_ConGetOutReq(i) );
    return p;
}